

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_orderedby(lysp_ctx *ctx,lysp_stmt *stmt,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  LY_ERR LVar2;
  size_t sVar3;
  char *pcVar4;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ctx *local_50;
  lysp_stmt *plStack_40;
  LY_ERR ret___1;
  lysp_stmt *child;
  LY_ERR ret__;
  int arg_len;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  if ((*flags & 0xc0) == 0) {
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      sVar3 = strlen(stmt->arg);
      if (((int)sVar3 == 6) && (iVar1 = strncmp(stmt->arg,"system",6), iVar1 == 0)) {
        *flags = *flags | 0x20;
      }
      else {
        if (((int)sVar3 != 4) || (iVar1 = strncmp(stmt->arg,"user",4), iVar1 != 0)) {
          if (ctx == (lysp_ctx *)0x0) {
            local_58 = (ly_ctx *)0x0;
          }
          else {
            local_58 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                  sVar3 & 0xffffffff,stmt->arg,"ordered-by");
          return LY_EVALID;
        }
        *flags = *flags | 0x40;
      }
      for (plStack_40 = stmt->child; plStack_40 != (lysp_stmt *)0x0; plStack_40 = plStack_40->next)
      {
        if (plStack_40->kw != LY_STMT_EXTENSION_INSTANCE) {
          if (ctx == (lysp_ctx *)0x0) {
            local_60 = (ly_ctx *)0x0;
          }
          else {
            local_60 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = lyplg_ext_stmt2str(plStack_40->kw);
          ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"ordered-by");
          return LY_EVALID;
        }
        LVar2 = lysp_stmt_ext(ctx,plStack_40,LY_STMT_ORDERED_BY,0,exts);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_50 = (ly_ctx *)0x0;
    }
    else {
      local_50 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_50,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","ordered-by");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_orderedby(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint16_t *flags, struct lysp_ext_instance **exts)
{
    int arg_len;

    if (*flags & LYS_ORDBY_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "ordered-by");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if ((arg_len == ly_strlen_const("system")) && !strncmp(stmt->arg, "system", arg_len)) {
        *flags |= LYS_MAND_TRUE;
    } else if ((arg_len == ly_strlen_const("user")) && !strncmp(stmt->arg, "user", arg_len)) {
        *flags |= LYS_MAND_FALSE;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "ordered-by");
        return LY_EVALID;
    }

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_ORDERED_BY, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "ordered-by");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}